

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O3

void lqUpdateForNewLocation(lqInternalDB *lq,lqClientProxy *object,float x,float y,float z)

{
  lqClientProxy *plVar1;
  lqClientProxy **pplVar2;
  
  pplVar2 = lqBinForLocation(lq,x,y,z);
  object->x = x;
  object->y = y;
  object->z = z;
  if (pplVar2 != object->bin) {
    lqRemoveFromBin(object);
    if (*pplVar2 == (lqClientProxy *)0x0) {
      object->prev = (lqClientProxy *)0x0;
      object->next = (lqClientProxy *)0x0;
    }
    else {
      object->prev = (lqClientProxy *)0x0;
      plVar1 = *pplVar2;
      object->next = plVar1;
      plVar1->prev = object;
    }
    *pplVar2 = object;
    object->bin = pplVar2;
  }
  return;
}

Assistant:

void lqUpdateForNewLocation  (lqInternalDB* lq, 
			      lqClientProxy* object, 
			      float x, float y, float z)
{
    /* find bin for new location */
    lqClientProxy** newBin = lqBinForLocation (lq, x, y, z);

    /* store location in client object, for future reference */
    object->x = x;
    object->y = y;
    object->z = z;

    /* has object moved into a new bin? */
    if (newBin != object->bin)
    {
	lqRemoveFromBin (object);
 	lqAddToBin (object, newBin);
    }
}